

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_stream.c
# Opt level: O1

void handle_first_write(cio_io_stream *io_stream,void *handler_context,cio_write_buffer *buffer,
                       cio_error err,size_t bytes_transferred)

{
  cio_buffered_stream *buffered_stream;
  
  if (err != CIO_SUCCESS) {
    (**(code **)((long)handler_context + 0x38))
              (handler_context,*(undefined8 *)((long)handler_context + 0x40),err);
    return;
  }
  if ((buffer->data).element.length == bytes_transferred) {
    (**(code **)((long)handler_context + 0x38))
              (handler_context,*(undefined8 *)((long)handler_context + 0x40),0);
    return;
  }
  handle_partial_writes((cio_buffered_stream *)handler_context,io_stream,buffer,bytes_transferred);
  return;
}

Assistant:

static void handle_first_write(struct cio_io_stream *io_stream, void *handler_context, struct cio_write_buffer *buffer, enum cio_error err, size_t bytes_transferred)
{
	struct cio_buffered_stream *buffered_stream = handler_context;
	if (cio_unlikely(err != CIO_SUCCESS)) {
		buffered_stream->write_handler(buffered_stream, buffered_stream->write_handler_context, err);
		return;
	}

	if (cio_likely(bytes_transferred == buffer->data.head.total_length)) {
		buffered_stream->write_handler(buffered_stream, buffered_stream->write_handler_context, err);
		return;
	}

	handle_partial_writes(buffered_stream, io_stream, buffer, bytes_transferred);
}